

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

mdl_t * get_params_obj_var(int argc,char **argv)

{
  opt_t *poVar1;
  mdl_t *pmVar2;
  FILE *pFVar3;
  FILE *file;
  mdl_t *mdl;
  opt_t *opt;
  rdr_t *in_stack_ffffffffffffffe0;
  
  poVar1 = get_default_opt();
  opt_parse(argc,argv,opt);
  rdr_new(SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x38,0));
  pmVar2 = mdl_new(in_stack_ffffffffffffffe0);
  pmVar2->opt = poVar1;
  if (pmVar2->opt->model == (char *)0x0) {
    fatal("you must specify a model");
  }
  info("[Wapiti] Loading model: \"%s\"\n",pmVar2->opt->model);
  pFVar3 = fopen(pmVar2->opt->model,"r");
  if (pFVar3 == (FILE *)0x0) {
    pfatal("cannot open input model file: %s",pmVar2->opt->model);
  }
  mdl_load((mdl_t *)opt,(FILE *)mdl);
  return pmVar2;
}

Assistant:

mdl_t* get_params_obj_var(int argc, char** argv) {
            opt_t *opt = get_default_opt();

            opt_parse(argc, argv, opt);
            mdl_t *mdl = mdl_new(rdr_new(opt->maxent));
            mdl->opt = opt;
            if (mdl->opt->model == NULL)
                fatal("you must specify a model");
            info("[Wapiti] Loading model: \"%s\"\n", mdl->opt->model);
            FILE *file = fopen(mdl->opt->model, "r");
            if (file == NULL) {
                pfatal("cannot open input model file: %s", mdl->opt->model);
            }
            mdl_load(mdl, file);

            return mdl;
    }